

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int RunLicense(undefined8 param_1,undefined4 param_2,undefined8 param_3,Commandline *param_4)

{
  int iVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> command;
  string local_208 [32];
  LicenseAccess device;
  stringstream stream;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [23];
  
  bhf::ads::LicenseAccess::LicenseAccess(&device,param_3,param_1,param_2);
  _stream = (pointer)local_180;
  local_180[0]._M_local_buf[0] = '\0';
  bhf::Commandline::Pop<std::__cxx11::string>(&command,param_4,(string *)&stream);
  std::__cxx11::string::~string((string *)&stream);
  iVar1 = std::__cxx11::string::compare((char *)&command);
  if (iVar1 == 0) {
    iVar1 = bhf::ads::LicenseAccess::ShowOnlineInfo((ostream *)&device);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&command);
    if (iVar1 == 0) {
      iVar1 = bhf::ads::LicenseAccess::ShowPlatformId((ostream *)&device);
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)&command);
      if (iVar1 == 0) {
        iVar1 = bhf::ads::LicenseAccess::ShowSystemId((ostream *)&device);
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)&command);
        if (iVar1 == 0) {
          iVar1 = bhf::ads::LicenseAccess::ShowVolumeNo((ostream *)&device);
        }
        else {
          std::__cxx11::stringstream::stringstream((stringstream *)&stream);
          poVar2 = std::operator<<((ostream *)local_180[0]._M_local_buf,"RunLicense");
          poVar2 = std::operator<<(poVar2,"(): Unknown license command \'");
          poVar2 = std::operator<<(poVar2,(string *)&command);
          std::operator<<(poVar2,"\'\n");
          std::__cxx11::stringbuf::str();
          Logger::Log(3,local_208);
          std::__cxx11::string::~string(local_208);
          std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
          iVar1 = -1;
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&command);
  AdsDevice::~AdsDevice((AdsDevice *)&device);
  return iVar1;
}

Assistant:

int RunLicense(const AmsNetId netid, const uint16_t port, const std::string& gw, bhf::Commandline& args)
{
    auto device = bhf::ads::LicenseAccess{ gw, netid, port };
    const auto command = args.Pop<std::string>();

    if (!command.compare("onlineinfo")) {
        return device.ShowOnlineInfo(std::cout);
    } else if (!command.compare("platformid")) {
        return device.ShowPlatformId(std::cout);
    } else if (!command.compare("systemid")) {
        return device.ShowSystemId(std::cout);
    } else if (!command.compare("volumeno")) {
        return device.ShowVolumeNo(std::cout);
    } else {
        LOG_ERROR(__FUNCTION__ << "(): Unknown license command '" << command << "'\n");
        return -1;
    }
}